

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::find(Value *this,char *key,char *end)

{
  iterator iVar1;
  undefined8 extraout_RAX;
  Value *pVVar2;
  CZString actualKey;
  string local_1a0;
  key_type local_180 [7];
  ios_base local_110 [264];
  
  if (this->field_0x8 == '\0') {
    pVVar2 = (Value *)0x0;
  }
  else {
    if (this->field_0x8 != '\a') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,
                 "in Json::Value::find(key, end, found): requires objectValue or nullValue",0x48);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
      std::ios_base::~ios_base(local_110);
      _Unwind_Resume(extraout_RAX);
    }
    local_180[0].field_1.index_ = ((int)end - (int)key) * 4;
    local_180[0].cstr_ = key;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,local_180);
    pVVar2 = (Value *)0x0;
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      pVVar2 = (Value *)&iVar1._M_node[1]._M_left;
    }
    if ((local_180[0].cstr_ != (char *)0x0) && ((local_180[0].field_1.index_ & 3) == 1)) {
      free(local_180[0].cstr_);
    }
  }
  return pVVar2;
}

Assistant:

Value const* Value::find(char const* key, char const* end) const
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::find(key, end, found): requires objectValue or nullValue");
  if (type_ == nullValue) return NULL;
  CZString actualKey(key, static_cast<unsigned>(end-key), CZString::noDuplication);
  ObjectValues::const_iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end()) return NULL;
  return &(*it).second;
}